

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3AppendSpace(StrAccum *pAccum,int N)

{
  bool bVar1;
  int N_00;
  
  N_00 = N;
  if (0x1c < N) {
    do {
      sqlite3StrAccumAppend(pAccum,"                             ",0x1d);
      N_00 = N + -0x1d;
      bVar1 = 0x39 < N;
      N = N_00;
    } while (bVar1);
  }
  if (N_00 < 1) {
    return;
  }
  sqlite3StrAccumAppend(pAccum,"                             ",N_00);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AppendSpace(StrAccum *pAccum, int N){
  static const char zSpaces[] = "                             ";
  while( N>=(int)sizeof(zSpaces)-1 ){
    sqlite3StrAccumAppend(pAccum, zSpaces, sizeof(zSpaces)-1);
    N -= sizeof(zSpaces)-1;
  }
  if( N>0 ){
    sqlite3StrAccumAppend(pAccum, zSpaces, N);
  }
}